

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::compiler::Resolution> * __thiscall
kj::ArrayBuilder<capnp::compiler::Resolution>::operator=
          (ArrayBuilder<capnp::compiler::Resolution> *this,
          ArrayBuilder<capnp::compiler::Resolution> *other)

{
  Resolution *pRVar1;
  RemoveConst<capnp::compiler::Resolution> *pRVar2;
  Resolution *pRVar3;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Resolution *)0x0) {
    pRVar2 = this->pos;
    pRVar3 = this->endPtr;
    this->ptr = (Resolution *)0x0;
    this->pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
    this->endPtr = (Resolution *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pRVar1,0x20,(long)pRVar2 - (long)pRVar1 >> 5,
               (long)pRVar3 - (long)pRVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::compiler::Resolution>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Resolution *)0x0;
  other->pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
  other->endPtr = (Resolution *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }